

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  ostream *poVar1;
  char **in_RSI;
  int in_EDI;
  Error error;
  Argengine ae;
  anon_class_16_2_3ed67e4c *in_stack_fffffffffffffcf8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffd00;
  allocator<char> *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd38;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd40;
  iterator in_stack_fffffffffffffd48;
  size_type in_stack_fffffffffffffd50;
  string *local_2a0;
  string *local_260;
  int local_220;
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8 [40];
  undefined1 local_1a0 [38];
  undefined1 local_17a;
  allocator<char> local_179;
  string *local_178;
  string local_170 [32];
  string *local_150;
  undefined8 local_148;
  undefined1 local_140 [55];
  allocator<char> local_109;
  string local_108 [32];
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 local_d8 [34];
  undefined1 local_b6;
  allocator<char> local_b5 [20];
  allocator<char> local_a1;
  string *local_a0;
  string local_98 [32];
  undefined1 local_78 [32];
  string *local_58;
  undefined8 local_50;
  undefined1 local_48 [48];
  uint local_4;
  
  local_4 = 0;
  juzzlin::Argengine::Argengine((Argengine *)&stack0xffffffffffffffe8,in_EDI,in_RSI,true);
  local_b6 = 1;
  local_a0 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  local_a0 = (string *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  local_b6 = 0;
  local_58 = local_98;
  local_50 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x105549);
  __l._M_len = in_stack_fffffffffffffd50;
  __l._M_array = in_stack_fffffffffffffd48;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffd40,__l,in_stack_fffffffffffffd38,
        (allocator_type *)in_stack_fffffffffffffd30);
  local_e8 = &stack0xfffffffffffffff8;
  local_e0 = &stack0xfffffffffffffff0;
  std::function<void()>::function<main::__0,void>
            ((function<void_()> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  juzzlin::Argengine::addOption(&stack0xffffffffffffffe8,local_48,local_d8,0,local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::function<void_()>::~function((function<void_()> *)0x105630);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x10563d);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10564a);
  local_260 = (string *)&local_58;
  do {
    local_260 = local_260 + -0x20;
    std::__cxx11::string::~string(local_260);
  } while (local_260 != local_98);
  std::allocator<char>::~allocator(local_b5);
  std::allocator<char>::~allocator(&local_a1);
  local_17a = 1;
  local_178 = local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  local_17a = 0;
  local_150 = local_170;
  local_148 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x105742);
  __l_00._M_len = in_stack_fffffffffffffd50;
  __l_00._M_array = in_stack_fffffffffffffd48;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffd40,__l_00,in_stack_fffffffffffffd38,
        (allocator_type *)in_stack_fffffffffffffd30);
  std::function<void(std::__cxx11::string)>::function<main::__1,void>
            (in_stack_fffffffffffffd00,(anon_class_1_0_00000001 *)in_stack_fffffffffffffcf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  juzzlin::Argengine::addOption(&stack0xffffffffffffffe8,local_140,local_1a0,1,local_1c8,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x105861);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x10586e);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10587b);
  local_2a0 = (string *)&local_150;
  do {
    local_2a0 = local_2a0 + -0x20;
    std::__cxx11::string::~string(local_2a0);
  } while (local_2a0 != local_170);
  std::allocator<char>::~allocator(&local_179);
  juzzlin::Argengine::Error::Error((Error *)0x1058d7);
  juzzlin::Argengine::parse((Error *)&stack0xffffffffffffffe8);
  if (local_220 != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,local_218);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    juzzlin::Argengine::printHelp();
  }
  local_4 = (uint)(local_220 != 0);
  juzzlin::Argengine::Error::~Error((Error *)0x105c7d);
  juzzlin::Argengine::~Argengine((Argengine *)&stack0xffffffffffffffe8);
  return local_4;
}

Assistant:

int main(int argc, char ** argv)
{
    // Instantiate Argengine and give it the raw argument data.
    Argengine ae(argc, argv);

    // Add option "-a" that, when set, prints all arguments given to the binary.
    ae.addOption(
      { "-a", "--arguments" }, [&] {
          for (int i = 0; i < argc; i++) {
              std::cout << argv[i] << std::endl;
          }
      },
      false, "Print arguments."); // Set the option non-required and set documentation string.

    // Add option "-p" that prints the length of the given string e.g. "-p FOO".
    ae.addOption(
      { "-p" }, [](std::string value) {
          std::cout << value.size() << std::endl;
      },
      true, "Print length of given text. This option is required.", "TEXT"); // Set the option required and set documentation string and variable name shown in the documentation.

    // Parse the arguments and store possible error to variable error.
    Argengine::Error error;
    ae.parse(error);

    // Check error and print the possible error message.
    if (error.code != Argengine::Error::Code::Ok) {
        std::cerr << error.message << std::endl
                  << std::endl;
        ae.printHelp(); // Print the auto-generated help.
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}